

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DestroyContext::DestroyContext
          (DestroyContext *this,SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *contex)

{
  SharedPtr<tcu::ThreadUtil::Object> local_28;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"DestroyContext");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__DestroyContext_01e08258;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_context,contex);
  local_28.m_ptr = &((this->m_context).m_ptr)->super_Object;
  local_28.m_state = (this->m_context).m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_28);
  de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_28);
  return;
}

Assistant:

DestroyContext::DestroyContext (SharedPtr<GLES2Context> contex)
	: tcu::ThreadUtil::Operation	("DestroyContext")
	, m_context					(contex)
{
	modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_context));
}